

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

void __thiscall NoViableAltException::NoViableAltException(NoViableAltException *this,RefAST *t)

{
  ParserException *in_RSI;
  RefCount<AST> *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator *this_00;
  Token *in_stack_ffffffffffffffc8;
  RefCount<Token> *in_stack_ffffffffffffffd0;
  
  this_00 = (allocator *)&stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"NoViableAlt",this_00);
  ParserException::ParserException(in_RSI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  in_RDI->ref = (Ref *)&PTR__NoViableAltException_0036cab0;
  RefCount<Token>::RefCount(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  RefCount<AST>::RefCount((RefCount<AST> *)this_00,in_RDI);
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefAST t)
: ParserException("NoViableAlt")
, token(0)
, node(t)
{
}